

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateFunctionCall4(ExpressionContext *ctx,SynBase *source,InplaceStr name,ExprBase *arg0,
                   ExprBase *arg1,ExprBase *arg2,ExprBase *arg3,bool allowFailure,bool allowInternal
                   ,bool allowFastLookup)

{
  InplaceStr name_00;
  ExprBase *pEVar1;
  ArrayView<ArgumentData> arguments_00;
  undefined1 local_218 [12];
  char *local_208;
  char *pcStack_200;
  ArgumentData local_1f0;
  ArgumentData local_1c0;
  ArgumentData local_190;
  ArgumentData local_150;
  undefined1 local_120 [8];
  SmallArray<ArgumentData,_4U> arguments;
  bool allowFastLookup_local;
  bool allowInternal_local;
  bool allowFailure_local;
  ExprBase *arg1_local;
  ExprBase *arg0_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  InplaceStr name_local;
  
  arguments.allocator._7_1_ = allowFailure;
  arguments.allocator._6_1_ = allowInternal;
  arguments.allocator._5_1_ = allowFastLookup;
  SmallArray<ArgumentData,_4U>::SmallArray((SmallArray<ArgumentData,_4U> *)local_120,ctx->allocator)
  ;
  ArgumentData::ArgumentData(&local_150,arg0->source,false,(SynIdentifier *)0x0,arg0->type,arg0);
  SmallArray<ArgumentData,_4U>::push_back((SmallArray<ArgumentData,_4U> *)local_120,&local_150);
  ArgumentData::ArgumentData(&local_190,arg1->source,false,(SynIdentifier *)0x0,arg1->type,arg1);
  SmallArray<ArgumentData,_4U>::push_back((SmallArray<ArgumentData,_4U> *)local_120,&local_190);
  ArgumentData::ArgumentData(&local_1c0,arg2->source,false,(SynIdentifier *)0x0,arg2->type,arg2);
  SmallArray<ArgumentData,_4U>::push_back((SmallArray<ArgumentData,_4U> *)local_120,&local_1c0);
  ArgumentData::ArgumentData(&local_1f0,arg3->source,false,(SynIdentifier *)0x0,arg3->type,arg3);
  SmallArray<ArgumentData,_4U>::push_back((SmallArray<ArgumentData,_4U> *)local_120,&local_1f0);
  local_208 = name.begin;
  pcStack_200 = name.end;
  ArrayView<ArgumentData>::ArrayView<4u>
            ((ArrayView<ArgumentData> *)local_218,(SmallArray<ArgumentData,_4U> *)local_120);
  name_00.end = pcStack_200;
  name_00.begin = local_208;
  arguments_00._12_4_ = 0;
  arguments_00.data = (ArgumentData *)local_218._0_8_;
  arguments_00.count = local_218._8_4_;
  pEVar1 = CreateFunctionCallByName
                     (ctx,source,name_00,arguments_00,(bool)(arguments.allocator._7_1_ & 1),
                      (bool)(arguments.allocator._6_1_ & 1),(bool)(arguments.allocator._5_1_ & 1));
  SmallArray<ArgumentData,_4U>::~SmallArray((SmallArray<ArgumentData,_4U> *)local_120);
  return pEVar1;
}

Assistant:

ExprBase* CreateFunctionCall4(ExpressionContext &ctx, SynBase *source, InplaceStr name, ExprBase *arg0, ExprBase *arg1, ExprBase *arg2, ExprBase *arg3, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 4> arguments(ctx.allocator);

	arguments.push_back(ArgumentData(arg0->source, false, NULL, arg0->type, arg0));
	arguments.push_back(ArgumentData(arg1->source, false, NULL, arg1->type, arg1));
	arguments.push_back(ArgumentData(arg2->source, false, NULL, arg2->type, arg2));
	arguments.push_back(ArgumentData(arg3->source, false, NULL, arg3->type, arg3));

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}